

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase *
EvaluateVariableDefinitions(ExpressionEvalContext *ctx,ExprVariableDefinitions *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  bool bVar4;
  int iVar5;
  ExprBase *pEVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  IntrusiveList<ExprBase> *pIVar8;
  
  bVar4 = AddInstruction(ctx);
  if (bVar4) {
    pIVar8 = &expression->definitions;
    do {
      pEVar7 = pIVar8->head;
      if (pEVar7 == (ExprBase *)0x0) {
        pAVar1 = ctx->ctx->allocator;
        iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
        pSVar2 = (expression->super_ExprBase).source;
        pTVar3 = ctx->ctx->typeVoid;
        pEVar7->typeID = 2;
        pEVar7->source = pSVar2;
        pEVar7->type = pTVar3;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
        pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
        return pEVar7;
      }
      pEVar6 = Evaluate(ctx,pEVar7);
      pIVar8 = (IntrusiveList<ExprBase> *)&pEVar7->next;
    } while (pEVar6 != (ExprBase *)0x0);
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateVariableDefinitions(ExpressionEvalContext &ctx, ExprVariableDefinitions *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	for(ExprBase *definition = expression->definitions.head; definition; definition = definition->next)
	{
		if(!Evaluate(ctx, definition))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}